

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool __thiscall Lexer::next(Lexer *this,Token req)

{
  _Map_pointer ppTVar1;
  _Map_pointer ppTVar2;
  TokenInfo *pTVar3;
  TokenInfo *pTVar4;
  _Elt_pointer pTVar5;
  TokenInfo *pTVar6;
  _Map_pointer ppTVar7;
  bool bVar8;
  TokenInfo *pTVar9;
  _Map_pointer ppTVar10;
  bool local_3a;
  bool local_39;
  _Elt_pointer local_38;
  
  ppTVar1 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppTVar2 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pTVar3 = (this->m_tokens)._deque.
           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pTVar4 = (this->m_tokens)._deque.
           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if (((int)((ulong)((long)(this->m_tokens)._deque.
                           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_last - (long)pTVar4) >> 4) *
       -0x33333333 +
       (int)((ulong)((long)pTVar3 -
                    (long)(this->m_tokens)._deque.
                          super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) * -0x33333333 +
       ((int)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3) + -1 +
       (uint)(ppTVar1 == (_Map_pointer)0x0)) * 6 & 0xfffffffe) == 0) {
    return false;
  }
  pTVar5 = (this->m_tokenPosition)._M_cur;
  local_38 = (this->m_tokenPosition)._M_first;
  pTVar6 = (this->m_tokenPosition)._M_last;
  ppTVar7 = (this->m_tokenPosition)._M_node;
  pTVar9 = pTVar5 + 1;
  (this->m_tokenPosition)._M_cur = pTVar9;
  ppTVar10 = ppTVar7;
  if (pTVar9 == pTVar6) {
    ppTVar10 = ppTVar7 + 1;
    (this->m_tokenPosition)._M_node = ppTVar10;
    pTVar9 = ppTVar7[1];
    (this->m_tokenPosition)._M_first = pTVar9;
    (this->m_tokenPosition)._M_last = pTVar9 + 6;
    (this->m_tokenPosition)._M_cur = pTVar9;
  }
  if (pTVar9 == pTVar3) goto LAB_0011e77b;
  if (req == Any) {
    return true;
  }
  bVar8 = ppTVar10 < ppTVar1;
  if (ppTVar10 == ppTVar1) {
    bVar8 = pTVar9 < pTVar3;
  }
  if (bVar8) {
    bVar8 = ppTVar2 <= ppTVar10;
    if (ppTVar10 == ppTVar2) {
      bVar8 = pTVar4 <= pTVar9;
    }
    if (!bVar8) goto LAB_0011e74d;
  }
  else {
LAB_0011e74d:
    local_39 = false;
    local_3a = true;
    error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                     ,&local_39,&local_3a);
    pTVar9 = (this->m_tokenPosition)._M_cur;
  }
  if (pTVar9->type == req) {
    return true;
  }
LAB_0011e77b:
  (this->m_tokenPosition)._M_cur = pTVar5;
  (this->m_tokenPosition)._M_first = local_38;
  (this->m_tokenPosition)._M_last = pTVar6;
  (this->m_tokenPosition)._M_node = ppTVar7;
  return false;
}

Assistant:

bool Lexer::next (Token req)
{
	Iterator pos = m_tokenPosition;

	if (m_tokens.isEmpty() || m_tokens.size() == 1) // is 1 due to extra dummy token in the beginning
		return false;

	m_tokenPosition++;

	if (isAtEnd() or (req !=Token::Any and tokenType() != req))
	{
		m_tokenPosition = pos;
		return false;
	}

	return true;
}